

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriParse.c
# Opt level: O1

wchar_t * uriParsePctEncodedW(UriParserStateW *state,wchar_t *first,wchar_t *afterLast,
                             UriMemoryManager *memory)

{
  wchar_t *pwVar1;
  
  if ((first < afterLast) && (pwVar1 = first + 1, pwVar1 < afterLast)) {
    if (((uint)(*pwVar1 + L'\xffffffd0') < 0x37) &&
       ((0x7e0000007e03ffU >> ((ulong)(uint)(*pwVar1 + L'\xffffffd0') & 0x3f) & 1) != 0)) {
      pwVar1 = first + 2;
      if (afterLast <= pwVar1) goto LAB_001b5956;
      if (((uint)(*pwVar1 + L'\xffffffd0') < 0x37) &&
         ((0x7e0000007e03ffU >> ((ulong)(uint)(*pwVar1 + L'\xffffffd0') & 0x3f) & 1) != 0)) {
        return first + 3;
      }
    }
    uriFreeUriMembersMmW(state->uri,memory);
    state->errorPos = pwVar1;
  }
  else {
LAB_001b5956:
    uriFreeUriMembersMmW(state->uri,memory);
    state->errorPos = afterLast;
  }
  state->errorCode = L'\x01';
  return (wchar_t *)0x0;
}

Assistant:

static const URI_CHAR * URI_FUNC(ParsePctEncoded)(
		URI_TYPE(ParserState) * state,
		const URI_CHAR * first, const URI_CHAR * afterLast,
		UriMemoryManager * memory) {
	if (first >= afterLast) {
		URI_FUNC(StopSyntax)(state, afterLast, memory);
		return NULL;
	}

	/*
	First character has already been
	checked before entering this rule.

	switch (*first) {
	case _UT('%'):
	*/
		if (first + 1 >= afterLast) {
			URI_FUNC(StopSyntax)(state, afterLast, memory);
			return NULL;
		}

		switch (first[1]) {
		case URI_SET_HEXDIG:
			if (first + 2 >= afterLast) {
				URI_FUNC(StopSyntax)(state, afterLast, memory);
				return NULL;
			}

			switch (first[2]) {
			case URI_SET_HEXDIG:
				return first + 3;

			default:
				URI_FUNC(StopSyntax)(state, first + 2, memory);
				return NULL;
			}

		default:
			URI_FUNC(StopSyntax)(state, first + 1, memory);
			return NULL;
		}

	/*
	default:
		URI_FUNC(StopSyntax)(state, first, memory);
		return NULL;
	}
	*/
}